

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

htab_hash_t str_hash(tab_str_t str,void *arg)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar8 = str.str.len + 0x42;
  for (; 0xf < str.str.len; str.str.len = str.str.len - 0x10) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)str.str.s;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)((long)str.str.s + 8);
    uVar8 = SUB168(ZEXT816(0x288eea216831e6a7) * auVar6,8) +
            SUB168(ZEXT816(0x288eea216831e6a7) * auVar6,0) ^
            SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar5,8) +
            SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar5,0) ^ uVar8;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar8;
    uVar8 = SUB168(auVar1 * ZEXT816(0x65862b62bdf5ef4d),8) +
            SUB168(auVar1 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar8;
    str.str.s = (char *)((long)str.str.s + 0x10);
  }
  if (7 < str.str.len) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)str.str.s;
    uVar8 = uVar8 ^ SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar7,8) +
                    SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar7,0);
    str.str.len = str.str.len - 8;
    str.str.s = (char *)((long)str.str.s + 8);
  }
  if (str.str.len != 0) {
    if (str.str.len == 8) {
      uVar9 = *(ulong *)str.str.s;
    }
    else {
      if (str.str.len < 4) {
        uVar10 = 0;
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)(uint)*(ulong *)str.str.s << 0x20;
        uVar10 = 4;
      }
      if (uVar10 < str.str.len) {
        do {
          uVar9 = uVar9 >> 8 | (ulong)*(byte *)((long)str.str.s + uVar10) << 0x38;
          uVar10 = uVar10 + 1;
        } while (str.str.len != uVar10);
      }
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar9;
    uVar8 = uVar8 ^ SUB168(auVar2 * ZEXT816(0x288eea216831e6a7),8) +
                    SUB168(auVar2 * ZEXT816(0x288eea216831e6a7),0);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  uVar8 = SUB168(auVar3 * ZEXT816(0x65862b62bdf5ef4d),8) +
          SUB168(auVar3 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar8;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar8;
  return (uint)uVar8 ^
         SUB164(auVar4 * ZEXT816(0x288eea216831e6a7),8) +
         SUB164(auVar4 * ZEXT816(0x288eea216831e6a7),0);
}

Assistant:

static htab_hash_t str_hash (tab_str_t str, void *arg MIR_UNUSED) {
  return (htab_hash_t) mir_hash (str.str.s, str.str.len, 0x42);
}